

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

void httplib::detail::read_file(string *path,string *out)

{
  long lVar1;
  undefined1 auVar2 [16];
  fpos<__mbstate_t> local_250;
  undefined8 local_240;
  pos_type size;
  char local_220 [8];
  ifstream fs;
  string *out_local;
  string *path_local;
  
  std::ifstream::ifstream(local_220,(string *)path,_S_bin);
  std::istream::seekg((long)local_220,_S_beg);
  auVar2 = std::istream::tellg();
  size._M_off = auVar2._8_8_;
  local_240 = auVar2._0_8_;
  std::fpos<__mbstate_t>::fpos(&local_250,0);
  std::istream::seekg(local_220,local_250._M_off,local_250._M_state);
  std::fpos::operator_cast_to_long((fpos *)&local_240);
  std::__cxx11::string::resize((ulong)out);
  lVar1 = std::__cxx11::string::operator[]((ulong)out);
  std::fpos::operator_cast_to_long((fpos *)&local_240);
  std::istream::read(local_220,lVar1);
  std::ifstream::~ifstream(local_220);
  return;
}

Assistant:

inline void read_file(const std::string& path, std::string& out)
{
    std::ifstream fs(path, std::ios_base::binary);
    fs.seekg(0, std::ios_base::end);
    auto size = fs.tellg();
    fs.seekg(0);
    out.resize(static_cast<size_t>(size));
    fs.read(&out[0], size);
}